

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

bool __thiscall
deqp::gls::UniformBlockCase::checkLayoutIndices(UniformBlockCase *this,UniformLayout *layout)

{
  bool bVar1;
  deBool dVar2;
  size_type sVar3;
  MessageBuilder *pMVar4;
  reference piVar5;
  MessageBuilder local_360;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1e0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1d8;
  const_iterator uniformIter;
  BlockLayoutEntry *block;
  int blockNdx;
  MessageBuilder local_1b8;
  const_reference local_38;
  UniformLayoutEntry *uniform;
  int uniformNdx;
  int iStack_24;
  bool isOk;
  int numBlocks;
  int numUniforms;
  TestLog *log;
  UniformLayout *layout_local;
  UniformBlockCase *this_local;
  
  log = (TestLog *)layout;
  layout_local = (UniformLayout *)this;
  _numBlocks = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  sVar3 = std::
          vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
          ::size((vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                  *)(log + 3));
  iStack_24 = (int)sVar3;
  sVar3 = std::
          vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
          ::size((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                  *)log);
  uniformNdx = (int)sVar3;
  uniform._7_1_ = 1;
  uniform._0_4_ = 0;
  do {
    if (iStack_24 <= (int)uniform) {
      for (block._0_4_ = 0; (int)block < uniformNdx; block._0_4_ = (int)block + 1) {
        uniformIter._M_current =
             (int *)std::
                    vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                    ::operator[]((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                  *)log,(long)(int)block);
        local_1d8._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              (&((const_reference)uniformIter._M_current)->activeUniformIndices);
        while( true ) {
          local_1e0._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)(uniformIter._M_current + 10))
          ;
          bVar1 = __gnu_cxx::operator!=(&local_1d8,&local_1e0);
          if (!bVar1) break;
          piVar5 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_1d8);
          dVar2 = deInBounds32(*piVar5,0,iStack_24);
          if (dVar2 == 0) {
            tcu::TestLog::operator<<
                      (&local_360,_numBlocks,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar4 = tcu::MessageBuilder::operator<<
                               (&local_360,(char (*) [37])"Error: Invalid active uniform index ");
            piVar5 = __gnu_cxx::
                     __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_1d8);
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,piVar5);
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [12])0x2c3b643);
            pMVar4 = tcu::MessageBuilder::operator<<
                               (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)uniformIter._M_current);
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b43b10);
            tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_360);
            uniform._7_1_ = 0;
          }
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++(&local_1d8,0);
        }
      }
      return (bool)(uniform._7_1_ & 1);
    }
    local_38 = std::
               vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
               ::operator[]((vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                             *)(log + 3),(long)(int)uniform);
    if (local_38->blockNdx < 0) {
LAB_0269c4c0:
      tcu::TestLog::operator<<(&local_1b8,_numBlocks,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_1b8,(char (*) [40])"Error: Invalid block index in uniform \'");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_38->name);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b43b10);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b8);
      uniform._7_1_ = 0;
    }
    else {
      dVar2 = deInBounds32(local_38->blockNdx,0,uniformNdx);
      if (dVar2 == 0) goto LAB_0269c4c0;
    }
    uniform._0_4_ = (int)uniform + 1;
  } while( true );
}

Assistant:

bool UniformBlockCase::checkLayoutIndices (const UniformLayout& layout) const
{
	TestLog&	log			= m_testCtx.getLog();
	int			numUniforms	= (int)layout.uniforms.size();
	int			numBlocks	= (int)layout.blocks.size();
	bool		isOk		= true;

	// Check uniform block indices.
	for (int uniformNdx = 0; uniformNdx < numUniforms; uniformNdx++)
	{
		const UniformLayoutEntry& uniform = layout.uniforms[uniformNdx];

		if (uniform.blockNdx < 0 || !deInBounds32(uniform.blockNdx, 0, numBlocks))
		{
			log << TestLog::Message << "Error: Invalid block index in uniform '" << uniform.name << "'" << TestLog::EndMessage;
			isOk = false;
		}
	}

	// Check active uniforms.
	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		const BlockLayoutEntry& block = layout.blocks[blockNdx];

		for (vector<int>::const_iterator uniformIter = block.activeUniformIndices.begin(); uniformIter != block.activeUniformIndices.end(); uniformIter++)
		{
			if (!deInBounds32(*uniformIter, 0, numUniforms))
			{
				log << TestLog::Message << "Error: Invalid active uniform index " << *uniformIter << " in block '" << block.name << "'" << TestLog::EndMessage;
				isOk = false;
			}
		}
	}

	return isOk;
}